

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion.c
# Opt level: O3

int ion_alloc(int fd,size_t len,size_t align,uint heap_mask,uint flags,ion_user_handle_t *handle)

{
  int iVar1;
  ion_allocation_data data;
  size_t local_28;
  size_t local_20;
  uint local_18;
  uint local_14;
  ion_user_handle_t local_10;
  
  local_10 = 0;
  if (handle == (ion_user_handle_t *)0x0) {
    iVar1 = -0x16;
  }
  else {
    local_28 = len;
    local_20 = align;
    local_18 = heap_mask;
    local_14 = flags;
    iVar1 = ion_ioctl(fd,-0x3fdfb700,&local_28);
    if (-1 < iVar1) {
      *handle = local_10;
    }
  }
  return iVar1;
}

Assistant:

int ion_alloc(int fd, size_t len, size_t align, unsigned int heap_mask,
	      unsigned int flags, ion_user_handle_t *handle)
{
	int ret;
	struct ion_allocation_data data = {
		.len		= len,
		.align		= align,
		.heap_id_mask	= heap_mask,
		.flags		= flags,
	};

	if (handle == NULL)
		return -EINVAL;

	ret = ion_ioctl(fd, ION_IOC_ALLOC, &data);
	if (ret < 0)
		return ret;
	*handle = data.handle;
	return ret;
}